

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O0

void __thiscall serialization::json_iarchive::load_object_start(json_iarchive *this)

{
  bool bVar1;
  reference ppGVar2;
  serialization_trace local_11;
  json_iarchive *pjStack_10;
  serialization_trace trace;
  json_iarchive *this_local;
  
  pjStack_10 = this;
  serialization_trace::serialization_trace<char_const(&)[18],char_const(&)[5]>
            (&local_11,(char (*) [18])"load_object_start",(char (*) [5])"json");
  bVar1 = std::
          stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
          ::empty(&this->stack_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!stack_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/json_iarchive.h"
                  ,0x49,"void serialization::json_iarchive::load_object_start() const");
  }
  bVar1 = std::
          stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
          ::empty(&this->stack_);
  if (!bVar1) {
    ppGVar2 = std::
              stack<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::deque<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>_>
              ::top(&this->stack_);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(*ppGVar2);
    if (bVar1) {
      return;
    }
  }
  throw_serialization_error("expect object","");
  return;
}

Assistant:

void load_object_start() const
    {
        serialization_trace trace(__func__, "json");
        assert(!stack_.empty());
        if(stack_.empty() || (!stack_.top()->IsObject()))
            throw_serialization_error("expect object", "");
    }